

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::EnumDescriptorProto::SharedDtor(EnumDescriptorProto *this)

{
  string *this_00;
  
  this_00 = this->name_;
  if (this_00 != (string *)internal::kEmptyString_abi_cxx11_) {
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00,0x20);
  }
  if ((default_instance_ != this) && (this->options_ != (EnumOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    return;
  }
  return;
}

Assistant:

void EnumDescriptorProto::SharedDtor() {
  if (name_ != &::google::protobuf::internal::kEmptyString) {
    delete name_;
  }
  if (this != default_instance_) {
    delete options_;
  }
}